

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O0

void envy_bios_print_mem_unk0d(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_mem_unk0d *peVar1;
  int local_2c;
  int i;
  envy_bios_mem_unk0d *unk0d;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  peVar1 = &(bios->mem).unk0d;
  if ((peVar1->offset != 0) && ((mask & 0x1000) != 0)) {
    if ((bios->mem).unk0d.valid == '\0') {
      fprintf((FILE *)out,"Failed to parse UNK0D table at 0x%x, version %x\n",(ulong)peVar1->offset,
              (ulong)(bios->mem).unk0d.version);
    }
    else {
      fprintf((FILE *)out,"UNK0D table at 0x%x, version %x\n",(ulong)peVar1->offset,
              (ulong)(bios->mem).unk0d.version);
      envy_bios_dump_hex(bios,out,(uint)peVar1->offset,(uint)(bios->mem).unk0d.hlen,mask);
      if ((mask & 0x80000000) != 0) {
        fprintf((FILE *)out,"\n");
      }
      for (local_2c = 0; local_2c < (int)(uint)(bios->mem).unk0d.entriesnum; local_2c = local_2c + 1
          ) {
        envy_bios_dump_hex(bios,out,(uint)(bios->mem).unk0d.entries[local_2c].offset,
                           (uint)(bios->mem).unk0d.rlen,mask);
        if ((mask & 0x80000000) != 0) {
          fprintf((FILE *)out,"\n");
        }
      }
      fprintf((FILE *)out,"\n");
    }
  }
  return;
}

Assistant:

void envy_bios_print_mem_unk0d(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_mem_unk0d *unk0d = &bios->mem.unk0d;
	int i;

	if (!unk0d->offset || !(mask & ENVY_BIOS_PRINT_MEM))
		return;
	if (!unk0d->valid) {
		fprintf(out, "Failed to parse UNK0D table at 0x%x, version %x\n", unk0d->offset, unk0d->version);
		return;
	}

	fprintf(out, "UNK0D table at 0x%x, version %x\n", unk0d->offset, unk0d->version);
	envy_bios_dump_hex(bios, out, unk0d->offset, unk0d->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	for (i = 0; i < unk0d->entriesnum; i++) {
		envy_bios_dump_hex(bios, out, unk0d->entries[i].offset, unk0d->rlen, mask);
		if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");
	}

	fprintf(out, "\n");
}